

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Thread.cpp
# Opt level: O3

bool __thiscall axl::sys::psx::Thread::detach(Thread *this)

{
  uint_t code;
  bool bVar1;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  bVar1 = true;
  if (this->m_isOpen == true) {
    code = pthread_detach(this->m_threadId);
    if (code == 0) {
      this->m_isOpen = false;
    }
    else {
      err::Error::Error((Error *)&local_28,code);
      local_48.m_p = (ErrorHdr *)0x0;
      local_48.m_hdr = (BufHdr *)0x0;
      local_48.m_size = 0;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
      err::setError((ErrorRef *)&local_48);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool
Thread::detach() {
	if (!m_isOpen)
		return true;

	int result = ::pthread_detach(m_threadId);
	if (result != 0)
		return err::fail(result);

	m_isOpen = false;
	return true;
}